

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O2

HighsStatus
solveLpIpx(HighsOptions *options,HighsTimer *timer,HighsLp *lp,HighsBasis *highs_basis,
          HighsSolution *highs_solution,HighsModelStatus *model_status,HighsInfo *highs_info,
          HighsCallback *callback)

{
  string *__lhs;
  HighsInt *pHVar1;
  HighsLogOptions *log_options_;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Parameters new_parameters;
  HighsInt HVar8;
  ipxint iVar9;
  __type _Var10;
  bool bVar11;
  uint uVar12;
  undefined4 uVar13;
  Int IVar14;
  HighsStatus HVar15;
  HighsStatus HVar16;
  undefined *__nbytes;
  long lVar17;
  void *__buf;
  size_type __new_size;
  uint *puVar18;
  undefined8 *puVar19;
  HighsModelStatus model_status_00;
  size_type __new_size_00;
  uint uVar20;
  byte bVar21;
  double dVar22;
  double extraout_XMM0_Qa;
  undefined1 in_stack_ffffffffffffee78 [184];
  undefined8 in_stack_ffffffffffffef30;
  undefined8 in_stack_ffffffffffffef38;
  undefined8 in_stack_ffffffffffffef40;
  undefined8 in_stack_ffffffffffffef48;
  undefined4 in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef54;
  undefined8 in_stack_ffffffffffffef58;
  HighsLogOptions *pHVar23;
  Int num_row;
  Int num_col;
  HighsBasis *local_1058;
  double local_1050;
  vector<char,_std::allocator<char>_> constraint_type;
  vector<double,_std::allocator<double>_> rhs;
  double offset;
  vector<int,_std::allocator<int>_> Ap;
  vector<double,_std::allocator<double>_> Av;
  vector<double,_std::allocator<double>_> col_ub;
  vector<double,_std::allocator<double>_> col_lb;
  vector<double,_std::allocator<double>_> objective;
  vector<int,_std::allocator<int>_> Ai;
  IpxSolution ipx_solution;
  string local_ea0;
  string local_e80;
  string local_e60;
  string local_e40;
  Info ipx_info;
  LpSolver lps;
  uint local_120 [2];
  undefined8 local_118;
  undefined8 local_110;
  double local_108;
  byte local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  int local_f4;
  double local_f0;
  double local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  double local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  uint local_64;
  HighsInt local_60;
  double local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined1 local_3b;
  HighsLogOptions *local_38;
  
  bVar21 = 0;
  highs_basis->valid = false;
  highs_solution->value_valid = false;
  highs_solution->dual_valid = false;
  local_1058 = highs_basis;
  resetModelStatusAndHighsInfo(model_status,highs_info);
  ipx::LpSolver::LpSolver(&lps);
  iVar6 = (options->super_HighsOptionsStruct).log_dev_level;
  uVar12 = (uint)(iVar6 == 1) * 2;
  __nbytes = (undefined *)(ulong)uVar12;
  uVar20 = 4;
  if (iVar6 != 3) {
    uVar20 = uVar12;
  }
  bVar11 = (options->super_HighsOptionsStruct).output_flag;
  uVar12 = (options->super_HighsOptionsStruct).ipx_dualize_strategy + 1;
  if (uVar12 < 5) {
    __nbytes = &DAT_0039bf60;
    uVar13 = *(undefined4 *)(&DAT_0039bf60 + (ulong)uVar12 * 4);
  }
  else {
    uVar13 = 0xffffffff;
  }
  bVar4 = (options->super_HighsOptionsStruct).log_to_console;
  bVar5 = (options->super_HighsOptionsStruct).timeless_log;
  dVar22 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  if (dVar2 <= dVar22) {
    dVar22 = dVar2;
  }
  dVar2 = (options->super_HighsOptionsStruct).time_limit;
  dVar3 = (options->super_HighsOptionsStruct).ipm_optimality_tolerance;
  local_1050 = (options->super_HighsOptionsStruct).start_crossover_tolerance;
  HVar8 = (options->super_HighsOptionsStruct).highs_analysis_level;
  HighsTimer::read(timer,0,__buf,(size_t)__nbytes);
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  iVar6 = (options->super_HighsOptionsStruct).ipm_iteration_limit;
  pHVar23 = (HighsLogOptions *)0x1;
  iVar7 = (highs_info->super_HighsInfoStruct).ipm_iteration_count;
  if ((options->super_HighsOptionsStruct).run_centring == false) {
    __lhs = &(options->super_HighsOptionsStruct).run_crossover;
    _Var10 = std::operator==(__lhs,&kHighsOnString_abi_cxx11_);
    if (_Var10) {
      pHVar23 = (HighsLogOptions *)0x1;
      local_98 = 1;
      local_90 = local_1050;
    }
    else {
      _Var10 = std::operator==(__lhs,&kHighsOffString_abi_cxx11_);
      local_98 = 0;
      pHVar23 = (HighsLogOptions *)0x1;
      local_90 = -1.0;
      if (!_Var10) {
        pHVar23 = (HighsLogOptions *)0xffffffffffffffff;
        local_98 = 0xffffffff;
        local_90 = local_1050;
      }
    }
  }
  else {
    local_98 = 0;
    local_90 = -1.0;
  }
  local_120[0] = (uint)(byte)(bVar11 & bVar4);
  local_118 = 0;
  local_110 = 0x4014000000000000;
  local_108 = dVar2 - extraout_XMM0_Qa;
  local_100 = (byte)HVar8 >> 4 & 1;
  local_fc = uVar13;
  local_f8 = 1;
  local_f4 = iVar6 - iVar7;
  local_f0 = dVar22;
  local_e8 = dVar3;
  local_e0 = 0x3e112e0be826d695;
  uStack_d8 = 0x3e112e0be826d695;
  local_d0 = 0x3fd3333333333333;
  local_c8 = 1;
  local_c0 = 0x3eb0c6f7a0b5ed8d;
  uStack_b8 = 0x4000000000000000;
  local_b0 = 0xa00002710;
  local_a8 = 0;
  local_a0 = 0x3fb0000000000000;
  local_88 = 0x3e7ad7f29abcaf48;
  uStack_80 = 0x3e7ad7f29abcaf48;
  local_78 = uVar20;
  local_74 = 0xffffffff;
  uStack_6c = 0xffffffff00000001;
  local_64 = (uint)(options->super_HighsOptionsStruct).run_centring;
  local_60 = (options->super_HighsOptionsStruct).max_centring_steps;
  local_58 = (options->super_HighsOptionsStruct).centring_ratio_tolerance;
  local_50 = 0x3ff8000000000000;
  uStack_48 = 0x3fe0000000000000;
  local_40 = 3;
  local_3c = 1;
  local_3b = bVar5;
  local_38 = log_options_;
  puVar18 = local_120;
  puVar19 = (undefined8 *)&stack0xffffffffffffee78;
  for (lVar17 = 0x1e; lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar19 = *(undefined8 *)puVar18;
    puVar18 = puVar18 + ((ulong)bVar21 * -2 + 1) * 2;
    puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
  }
  new_parameters.super_ipx_parameters.maxpasses = (int)in_stack_ffffffffffffef30;
  new_parameters.super_ipx_parameters.run_centring = (int)((ulong)in_stack_ffffffffffffef30 >> 0x20)
  ;
  new_parameters.super_ipx_parameters.display = in_stack_ffffffffffffee78._0_4_;
  new_parameters.super_ipx_parameters._4_4_ = in_stack_ffffffffffffee78._4_4_;
  new_parameters.super_ipx_parameters.logfile = (char *)in_stack_ffffffffffffee78._8_8_;
  new_parameters.super_ipx_parameters.print_interval = (double)in_stack_ffffffffffffee78._16_8_;
  new_parameters.super_ipx_parameters.time_limit = (double)in_stack_ffffffffffffee78._24_8_;
  new_parameters.super_ipx_parameters.analyse_basis_data = (bool)in_stack_ffffffffffffee78[0x20];
  new_parameters.super_ipx_parameters._33_3_ = in_stack_ffffffffffffee78._33_3_;
  new_parameters.super_ipx_parameters.dualize = in_stack_ffffffffffffee78._36_4_;
  new_parameters.super_ipx_parameters.scale = in_stack_ffffffffffffee78._40_4_;
  new_parameters.super_ipx_parameters.ipm_maxiter = in_stack_ffffffffffffee78._44_4_;
  new_parameters.super_ipx_parameters.ipm_feasibility_tol = (double)in_stack_ffffffffffffee78._48_8_
  ;
  new_parameters.super_ipx_parameters.ipm_optimality_tol = (double)in_stack_ffffffffffffee78._56_8_;
  new_parameters.super_ipx_parameters.ipm_drop_primal = (double)in_stack_ffffffffffffee78._64_8_;
  new_parameters.super_ipx_parameters.ipm_drop_dual = (double)in_stack_ffffffffffffee78._72_8_;
  new_parameters.super_ipx_parameters.kkt_tol = (double)in_stack_ffffffffffffee78._80_8_;
  new_parameters.super_ipx_parameters.crash_basis = in_stack_ffffffffffffee78._88_4_;
  new_parameters.super_ipx_parameters._92_4_ = in_stack_ffffffffffffee78._92_4_;
  new_parameters.super_ipx_parameters.dependency_tol = (double)in_stack_ffffffffffffee78._96_8_;
  new_parameters.super_ipx_parameters.volume_tol = (double)in_stack_ffffffffffffee78._104_8_;
  new_parameters.super_ipx_parameters.rows_per_slice = in_stack_ffffffffffffee78._112_4_;
  new_parameters.super_ipx_parameters.maxskip_updates = in_stack_ffffffffffffee78._116_4_;
  new_parameters.super_ipx_parameters.lu_kernel = in_stack_ffffffffffffee78._120_4_;
  new_parameters.super_ipx_parameters._124_4_ = in_stack_ffffffffffffee78._124_4_;
  new_parameters.super_ipx_parameters.lu_pivottol = (double)in_stack_ffffffffffffee78._128_8_;
  new_parameters.super_ipx_parameters.run_crossover = in_stack_ffffffffffffee78._136_4_;
  new_parameters.super_ipx_parameters._140_4_ = in_stack_ffffffffffffee78._140_4_;
  new_parameters.super_ipx_parameters.start_crossover_tol =
       (double)in_stack_ffffffffffffee78._144_8_;
  new_parameters.super_ipx_parameters.pfeasibility_tol = (double)in_stack_ffffffffffffee78._152_8_;
  new_parameters.super_ipx_parameters.dfeasibility_tol = (double)in_stack_ffffffffffffee78._160_8_;
  new_parameters.super_ipx_parameters.debug = in_stack_ffffffffffffee78._168_4_;
  new_parameters.super_ipx_parameters.switchiter = in_stack_ffffffffffffee78._172_4_;
  new_parameters.super_ipx_parameters.stop_at_switch = in_stack_ffffffffffffee78._176_4_;
  new_parameters.super_ipx_parameters.update_heuristic = in_stack_ffffffffffffee78._180_4_;
  new_parameters.super_ipx_parameters._192_8_ = in_stack_ffffffffffffef38;
  new_parameters.super_ipx_parameters.centring_ratio_tolerance = (double)in_stack_ffffffffffffef40;
  new_parameters.super_ipx_parameters.centring_ratio_reduction = (double)in_stack_ffffffffffffef48;
  new_parameters.super_ipx_parameters.centring_alpha_scaling._0_4_ = in_stack_ffffffffffffef50;
  new_parameters.super_ipx_parameters.centring_alpha_scaling._4_4_ = in_stack_ffffffffffffef54;
  new_parameters.super_ipx_parameters.bad_products_tolerance = (int)in_stack_ffffffffffffef58;
  new_parameters.super_ipx_parameters.highs_logging =
       (bool)(char)((ulong)in_stack_ffffffffffffef58 >> 0x20);
  new_parameters.super_ipx_parameters.timeless_log =
       (bool)(char)((ulong)in_stack_ffffffffffffef58 >> 0x28);
  new_parameters.super_ipx_parameters._230_2_ = (short)((ulong)in_stack_ffffffffffffef58 >> 0x30);
  new_parameters.super_ipx_parameters.log_options = pHVar23;
  ipx::LpSolver::SetParameters(&lps,new_parameters);
  ipx::LpSolver::SetCallback(&lps,callback);
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fillInIpxData(lp,&num_col,&num_row,&offset,&objective,&col_lb,&col_ub,&Ap,&Ai,&Av,&rhs,
                &constraint_type);
  __new_size_00 = (size_type)num_col;
  highsLogUser(log_options_,kInfo,"IPX model has %d rows, %d columns and %d nonzeros\n",
               (ulong)(uint)num_row,(ulong)(uint)num_col,
               (ulong)(uint)Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[__new_size_00]);
  IVar14 = ipx::LpSolver::LoadModel
                     (&lps,num_col,offset,
                      objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      col_lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      col_ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,num_row,
                      Ap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      Ai.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      Av.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      constraint_type.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  if (IVar14 == 0) {
    IVar14 = ipx::LpSolver::Solve(&lps);
    uVar12 = (options->super_HighsOptionsStruct).highs_analysis_level;
    ipx::LpSolver::GetInfo(&ipx_info,&lps);
    if ((uVar12 & 2) != 0) {
      reportSolveData(log_options_,&ipx_info);
    }
    pHVar1 = &(highs_info->super_HighsInfoStruct).ipm_iteration_count;
    *pHVar1 = *pHVar1 + ipx_info.super_ipx_info.iter;
    pHVar1 = &(highs_info->super_HighsInfoStruct).crossover_iteration_count;
    *pHVar1 = *pHVar1 + ipx_info.super_ipx_info.updates_crossover;
    if ((IVar14 == 1000) ||
       (HVar15 = reportIpxSolveStatus(options,IVar14,ipx_info.super_ipx_info.errflag),
       HVar15 != kError)) {
      HVar15 = reportIpxIpmCrossoverStatus(options,ipx_info.super_ipx_info.status_ipm,true);
      HVar16 = reportIpxIpmCrossoverStatus(options,ipx_info.super_ipx_info.status_crossover,false);
      if ((HVar15 != kError) && (HVar16 != kError)) {
        std::__cxx11::string::string
                  ((string *)&local_e40,"solve_status should be solved or stopped here but value is"
                   ,(allocator *)&ipx_solution);
        ipxStatusError(IVar14 != 0x3ed && IVar14 != 1000,options,&local_e40,IVar14);
        std::__cxx11::string::~string((string *)&local_e40);
        HVar15 = kError;
        if (IVar14 != 1000) {
          if (IVar14 != 0x3ed) goto LAB_0022d506;
          getHighsNonVertexSolution
                    (options,lp,num_col,num_row,&rhs,&constraint_type,&lps,kUnknown,highs_solution);
          bVar11 = illegalIpxStoppedCrossoverStatus(&ipx_info,options);
          if (bVar11) goto LAB_0022d506;
          if (ipx_info.super_ipx_info.status_crossover == 6) {
LAB_0022d712:
            *model_status = kTimeLimit;
          }
          else {
            bVar11 = illegalIpxStoppedIpmStatus(&ipx_info,options);
            if (bVar11) goto LAB_0022d506;
            if (ipx_info.super_ipx_info.status_ipm == 7) {
              *model_status = kIterationLimit;
            }
            else {
              if (ipx_info.super_ipx_info.status_ipm == 6) goto LAB_0022d712;
              if (ipx_info.super_ipx_info.status_ipm == 5) {
                *model_status = kInterrupt;
              }
              else {
                reportIpmNoProgress(options,&ipx_info);
                *model_status = kUnknown;
              }
            }
          }
          HVar15 = kWarning;
          goto LAB_0022d506;
        }
        std::__cxx11::string::string
                  ((string *)&local_e60,"solve_status should be solved here but value is",
                   (allocator *)&ipx_solution);
        ipxStatusError(false,options,&local_e60,1000);
        std::__cxx11::string::~string((string *)&local_e60);
        bVar11 = illegalIpxSolvedStatus(&ipx_info,options);
        if (bVar11) goto LAB_0022d506;
        uVar12 = ipx_info.super_ipx_info.status_ipm - 3;
        if (uVar12 < 2) {
          model_status_00 = ipx_info.super_ipx_info.status_ipm == 3 ^ kUnboundedOrInfeasible;
          *model_status = model_status_00;
          HVar15 = kOk;
          getHighsNonVertexSolution
                    (options,lp,num_col,num_row,&rhs,&constraint_type,&lps,model_status_00,
                     highs_solution);
          goto LAB_0022d506;
        }
        std::__cxx11::string::string
                  ((string *)&local_e80,
                   "ipm status should be not run, optimal or imprecise but value is",
                   (allocator *)&ipx_solution);
        ipxStatusError(uVar12 < 0xfffffffe,options,&local_e80,ipx_info.super_ipx_info.status_ipm);
        std::__cxx11::string::~string((string *)&local_e80);
        iVar9 = ipx_info.super_ipx_info.status_crossover;
        if (uVar12 < 0xfffffffe) goto LAB_0022d506;
        std::__cxx11::string::string
                  ((string *)&local_ea0,
                   "crossover status should be not run, optimal or imprecise but value is",
                   (allocator *)&ipx_solution);
        ipxStatusError(2 < (uint)iVar9,options,&local_ea0,ipx_info.super_ipx_info.status_crossover);
        std::__cxx11::string::~string((string *)&local_ea0);
        if (2 < (uint)iVar9) goto LAB_0022d506;
        if (ipx_info.super_ipx_info.status_crossover == 0) {
          getHighsNonVertexSolution
                    (options,lp,num_col,num_row,&rhs,&constraint_type,&lps,
                     (uint)(ipx_info.super_ipx_info.status_ipm == 2) * 8 + kOptimal,highs_solution);
LAB_0022da63:
          bVar11 = ipx_info.super_ipx_info.status_crossover == 2 ||
                   ipx_info.super_ipx_info.status_ipm == 2;
          (highs_info->super_HighsInfoStruct).basis_validity = (uint)local_1058->valid;
          HVar15 = (HighsStatus)bVar11;
          *model_status = (uint)bVar11 * 8 + kOptimal;
        }
        else {
          memset(&ipx_solution.ipx_col_value,0,0x90);
          ipx_solution.num_col = num_col;
          ipx_solution.num_row = num_row;
          std::vector<double,_std::allocator<double>_>::resize
                    (&ipx_solution.ipx_col_value,__new_size_00);
          __new_size = (size_type)num_row;
          std::vector<double,_std::allocator<double>_>::resize
                    (&ipx_solution.ipx_row_value,__new_size);
          std::vector<double,_std::allocator<double>_>::resize
                    (&ipx_solution.ipx_col_dual,__new_size_00);
          std::vector<double,_std::allocator<double>_>::resize
                    (&ipx_solution.ipx_row_dual,__new_size);
          std::vector<int,_std::allocator<int>_>::resize(&ipx_solution.ipx_row_status,__new_size);
          std::vector<int,_std::allocator<int>_>::resize(&ipx_solution.ipx_col_status,__new_size_00)
          ;
          uVar12 = ipx::LpSolver::GetBasicSolution
                             (&lps,ipx_solution.ipx_col_value.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start,
                              ipx_solution.ipx_row_value.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              ipx_solution.ipx_row_dual.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              ipx_solution.ipx_col_dual.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              ipx_solution.ipx_row_status.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              ipx_solution.ipx_col_status.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
          if (uVar12 == 0) {
            HVar16 = ipxBasicSolutionToHighsBasicSolution
                               (log_options_,lp,&rhs,&constraint_type,&ipx_solution,local_1058,
                                highs_solution);
            if (HVar16 == kOk) {
              IpxSolution::~IpxSolution(&ipx_solution);
              goto LAB_0022da63;
            }
            highsLogUser(log_options_,kError,
                         "Failed to convert IPX basic solution to Highs basic solution\n",
                         highs_solution);
          }
          else {
            highsLogUser(log_options_,kError,"IPX crossover getting basic solution: flag = %d\n",
                         (ulong)uVar12);
          }
          IpxSolution::~IpxSolution(&ipx_solution);
        }
        goto LAB_0022d506;
      }
    }
  }
  *model_status = kSolveError;
  HVar15 = kError;
LAB_0022d506:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&constraint_type.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rhs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Av.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&col_ub.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&col_lb.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&objective.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Ai.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Ap.super__Vector_base<int,_std::allocator<int>_>);
  ipx::LpSolver::~LpSolver(&lps);
  return HVar15;
}

Assistant:

HighsStatus solveLpIpx(const HighsOptions& options, HighsTimer& timer,
                       const HighsLp& lp, HighsBasis& highs_basis,
                       HighsSolution& highs_solution,
                       HighsModelStatus& model_status, HighsInfo& highs_info,
                       HighsCallback& callback) {
  // Use IPX to try to solve the LP
  //
  // Can return HighsModelStatus (HighsStatus) values:
  //
  // 1. kSolveError (kError) if various unlikely solution errors occur
  //
  // 2. kTimeLimit (kWarning) if time limit is reached
  //
  // 3. kIterationLimit (kWarning) if iteration limit is reached
  //
  // 4. kUnknown (kWarning) if IPM makes no progress or if
  // IPM/crossover are imprecise
  //
  // 5. kInfeasible (kOk) if IPM identifies primal infeasibility
  //
  // 6. kUnboundedOrInfeasible (kOk) if IPM identifies dual
  // infeasibility
  //
  // kOptimal (kOk) if IPM/crossover identify optimality
  //
  // With a non-error return, if just IPM has been run then a
  // non-vertex primal solution is obtained; if crossover has been run
  // then a basis and primal+dual solution are obtained.
  //
  //
  // Indicate that there is no valid primal solution, dual solution or basis
  highs_basis.valid = false;
  highs_solution.value_valid = false;
  highs_solution.dual_valid = false;
  // Indicate that no imprecise solution has (yet) been found
  resetModelStatusAndHighsInfo(model_status, highs_info);
  // Create the LpSolver instance
  ipx::LpSolver lps;
  // Set IPX parameters
  //
  // Cannot set internal IPX parameters directly since they are
  // private, so create instance of parameters
  ipx::Parameters parameters;
  // Set IPX parameters from options
  //
  // Set display according to output
  parameters.display = 1;
  if (!options.output_flag | !options.log_to_console) parameters.display = 0;
  // Modify parameters.debug according to log_dev_level
  parameters.debug = 0;
  if (options.log_dev_level == kHighsLogDevLevelDetailed) {
    // Default options.log_dev_level setting is kHighsLogDevLevelNone, yielding
    // default setting debug = 0
    parameters.debug = 0;
  } else if (options.log_dev_level == kHighsLogDevLevelInfo) {
    parameters.debug = 2;
  } else if (options.log_dev_level == kHighsLogDevLevelVerbose) {
    parameters.debug = 4;
  }
  parameters.highs_logging = true;
  parameters.timeless_log = options.timeless_log;
  parameters.log_options = &options.log_options;
  // Just test feasibility and optimality tolerances for now
  // ToDo Set more parameters
  //
  // Translate dualization option
  //
  // parameters.dualize = -2 => Possibly dualize - Filippo style
  // parameters.dualize = -1 => Possibly dualize - Lukas style
  // parameters.dualize = 0 => No dualization
  // parameters.dualize = 1 => Perform dualization
  if (options.ipx_dualize_strategy == kIpxDualizeStrategyOn) {
    parameters.dualize = 1;
  } else if (options.ipx_dualize_strategy == kIpxDualizeStrategyOff) {
    parameters.dualize = 0;
  } else if (options.ipx_dualize_strategy == kIpxDualizeStrategyLukas) {
    parameters.dualize = -1;
  } else if (options.ipx_dualize_strategy == kIpxDualizeStrategyFilippo) {
    parameters.dualize = -2;
  } else {
    assert(111 == 222);
  }

  parameters.ipm_feasibility_tol = min(options.primal_feasibility_tolerance,
                                       options.dual_feasibility_tolerance);

  parameters.ipm_optimality_tol = options.ipm_optimality_tolerance;
  parameters.start_crossover_tol = options.start_crossover_tolerance;
  parameters.analyse_basis_data =
      kHighsAnalysisLevelNlaData & options.highs_analysis_level;
  // Determine the run time allowed for IPX
  parameters.time_limit = options.time_limit - timer.read();
  parameters.ipm_maxiter =
      options.ipm_iteration_limit - highs_info.ipm_iteration_count;
  // Determine if crossover is to be run or not
  //
  // When doing analytic centring calculations, crossover must not be
  // run
  if (options.run_centring) {
    parameters.run_crossover = 0;
  } else if (options.run_crossover == kHighsOnString) {
    parameters.run_crossover = 1;
  } else if (options.run_crossover == kHighsOffString) {
    parameters.run_crossover = 0;
  } else {
    assert(options.run_crossover == kHighsChooseString);
    parameters.run_crossover = -1;
  }
  if (!parameters.run_crossover) {
    // If crossover is sure not to be run, then set crossover_start to
    // -1 so that IPX can terminate according to its feasibility and
    // optimality tolerances
    parameters.start_crossover_tol = -1;
  }

  parameters.run_centring = options.run_centring ? 1 : 0;
  parameters.max_centring_steps = options.max_centring_steps;
  parameters.centring_ratio_tolerance = options.centring_ratio_tolerance;

  // Set the internal IPX parameters
  lps.SetParameters(parameters);

  // Set pointer to any callback
  lps.SetCallback(&callback);

  ipx::Int num_col, num_row;
  double offset;
  std::vector<ipx::Int> Ap, Ai;
  std::vector<double> objective, col_lb, col_ub, Av, rhs;
  std::vector<char> constraint_type;
  fillInIpxData(lp, num_col, num_row, offset, objective, col_lb, col_ub, Ap, Ai,
                Av, rhs, constraint_type);
  highsLogUser(options.log_options, HighsLogType::kInfo,
               "IPX model has %" HIGHSINT_FORMAT " rows, %" HIGHSINT_FORMAT
               " columns and %" HIGHSINT_FORMAT " nonzeros\n",
               num_row, num_col, Ap[num_col]);

  ipx::Int load_status = lps.LoadModel(
      num_col, offset, objective.data(), col_lb.data(), col_ub.data(), num_row,
      Ap.data(), Ai.data(), Av.data(), rhs.data(), constraint_type.data());

  if (load_status) {
    model_status = HighsModelStatus::kSolveError;
    return HighsStatus::kError;
  }

  // Use IPX to solve the LP!
  ipx::Int solve_status = lps.Solve();

  const bool report_solve_data =
      kHighsAnalysisLevelSolverSummaryData & options.highs_analysis_level;
  // Get solver and solution information.
  // Struct ipx_info defined in ipx/ipx_info.h
  const ipx::Info ipx_info = lps.GetInfo();
  if (report_solve_data) reportSolveData(options.log_options, ipx_info);
  highs_info.ipm_iteration_count += (HighsInt)ipx_info.iter;
  highs_info.crossover_iteration_count += (HighsInt)ipx_info.updates_crossover;

  // If not solved...
  if (solve_status != IPX_STATUS_solved) {
    const HighsStatus solve_return_status =
        reportIpxSolveStatus(options, solve_status, ipx_info.errflag);
    // Return error if IPX solve error has occurred
    if (solve_return_status == HighsStatus::kError) {
      model_status = HighsModelStatus::kSolveError;
      return HighsStatus::kError;
    }
  }
  bool ipm_status = true;
  const HighsStatus ipm_return_status =
      reportIpxIpmCrossoverStatus(options, ipx_info.status_ipm, ipm_status);
  ipm_status = false;
  const HighsStatus crossover_return_status = reportIpxIpmCrossoverStatus(
      options, ipx_info.status_crossover, ipm_status);
  // Return error if IPX IPM or crossover error has occurred
  if (ipm_return_status == HighsStatus::kError ||
      crossover_return_status == HighsStatus::kError) {
    model_status = HighsModelStatus::kSolveError;
    return HighsStatus::kError;
  }
  // Should only reach here if Solve() returned IPX_STATUS_solved or
  // IPX_STATUS_stopped
  if (ipxStatusError(
          solve_status != IPX_STATUS_solved &&
              solve_status != IPX_STATUS_stopped,
          options, "solve_status should be solved or stopped here but value is",
          (int)solve_status))
    return HighsStatus::kError;

  // Only error returns so far
  //

  if (solve_status == IPX_STATUS_stopped) {
    // IPX stopped, so there's certainly no basic solution. Get the
    // non-vertex solution, though. This needs the model status to
    // know whether to worry about dual infeasibilities.
    const HighsModelStatus local_model_status = HighsModelStatus::kUnknown;
    getHighsNonVertexSolution(options, lp, num_col, num_row, rhs,
                              constraint_type, lps, local_model_status,
                              highs_solution);
    //
    // Look at the reason why IPX stopped
    //
    // Return error if stopped status settings occur that JAJH doesn't
    // think should happen
    //
    //==============
    // For crossover
    //==============
    if (illegalIpxStoppedCrossoverStatus(ipx_info, options))
      return HighsStatus::kError;
    // Can stop and reach time limit
    if (ipx_info.status_crossover == IPX_STATUS_time_limit) {
      model_status = HighsModelStatus::kTimeLimit;
      return HighsStatus::kWarning;
    }
    //========
    // For IPM
    //========
    //
    // Note that IPX can stop with IPM optimal, imprecise,
    // primal_infeas or dual_infeas, due to crossover stopping with
    // time limit, and this is why crossover returns are tested first
    if (illegalIpxStoppedIpmStatus(ipx_info, options))
      return HighsStatus::kError;
    // Can stop with user interrupt
    // Can stop with time limit
    // Can stop with iter limit
    // Can stop with no progress
    if (ipx_info.status_ipm == IPX_STATUS_user_interrupt) {
      model_status = HighsModelStatus::kInterrupt;
      return HighsStatus::kWarning;
    } else if (ipx_info.status_ipm == IPX_STATUS_time_limit) {
      model_status = HighsModelStatus::kTimeLimit;
      return HighsStatus::kWarning;
    } else if (ipx_info.status_ipm == IPX_STATUS_iter_limit) {
      model_status = HighsModelStatus::kIterationLimit;
      return HighsStatus::kWarning;
    } else {
      assert(ipx_info.status_ipm == IPX_STATUS_no_progress);
      reportIpmNoProgress(options, ipx_info);
      model_status = HighsModelStatus::kUnknown;
      return HighsStatus::kWarning;
    }
  }
  // Should only reach here if Solve() returned IPX_STATUS_solved
  if (ipxStatusError(solve_status != IPX_STATUS_solved, options,
                     "solve_status should be solved here but value is",
                     (int)solve_status))
    return HighsStatus::kError;
  // Return error if solved status settings occur that JAJH doesn't
  // think should happen
  if (illegalIpxSolvedStatus(ipx_info, options)) return HighsStatus::kError;
  //==============
  // For crossover
  //==============
  // Can be not run
  // Can solve and be optimal
  // Can solve and be imprecise
  //========
  // For IPM
  //========
  // Can solve and be optimal
  // Can solve and be imprecise
  // Can solve and be primal_infeas
  // Can solve and be dual_infeas
  if (ipx_info.status_ipm == IPX_STATUS_primal_infeas ||
      ipx_info.status_ipm == IPX_STATUS_dual_infeas) {
    // IPM identified primal or dual infeasibility: crossover will not
    // have run, so get the non-vertex solution and return
    if (ipx_info.status_ipm == IPX_STATUS_primal_infeas) {
      model_status = HighsModelStatus::kInfeasible;
    } else if (ipx_info.status_ipm == IPX_STATUS_dual_infeas) {
      model_status = HighsModelStatus::kUnboundedOrInfeasible;
    }
    getHighsNonVertexSolution(options, lp, num_col, num_row, rhs,
                              constraint_type, lps, model_status,
                              highs_solution);
    return HighsStatus::kOk;
  }

  // Should only reach here if IPM is optimal or imprecise
  if (ipxStatusError(ipx_info.status_ipm != IPX_STATUS_optimal &&
                         ipx_info.status_ipm != IPX_STATUS_imprecise,
                     options,
                     "ipm status should be not run, optimal or imprecise "
                     "but value is",
                     (int)ipx_info.status_ipm))
    return HighsStatus::kError;

  // Should only reach here if crossover is not run, optimal or imprecise
  if (ipxStatusError(ipx_info.status_crossover != IPX_STATUS_not_run &&
                         ipx_info.status_crossover != IPX_STATUS_optimal &&
                         ipx_info.status_crossover != IPX_STATUS_imprecise,
                     options,
                     "crossover status should be not run, optimal or imprecise "
                     "but value is",
                     (int)ipx_info.status_crossover))
    return HighsStatus::kError;

  // Basic solution depends on crossover being run
  const bool have_basic_solution =
      ipx_info.status_crossover != IPX_STATUS_not_run;
  // Both crossover and IPM can be imprecise
  const bool imprecise_solution =
      ipx_info.status_crossover == IPX_STATUS_imprecise ||
      ipx_info.status_ipm == IPX_STATUS_imprecise;
  if (have_basic_solution) {
    IpxSolution ipx_solution;
    ipx_solution.num_col = num_col;
    ipx_solution.num_row = num_row;
    ipx_solution.ipx_col_value.resize(num_col);
    ipx_solution.ipx_row_value.resize(num_row);
    ipx_solution.ipx_col_dual.resize(num_col);
    ipx_solution.ipx_row_dual.resize(num_row);
    ipx_solution.ipx_row_status.resize(num_row);
    ipx_solution.ipx_col_status.resize(num_col);
    ipx::Int errflag = lps.GetBasicSolution(
        ipx_solution.ipx_col_value.data(), ipx_solution.ipx_row_value.data(),
        ipx_solution.ipx_row_dual.data(), ipx_solution.ipx_col_dual.data(),
        ipx_solution.ipx_row_status.data(), ipx_solution.ipx_col_status.data());
    if (errflag != 0) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "IPX crossover getting basic solution: flag = %d\n",
                   (int)errflag);
      return HighsStatus::kError;
    }
    // Convert the IPX basic solution to a HiGHS basic solution
    HighsStatus status = ipxBasicSolutionToHighsBasicSolution(
        options.log_options, lp, rhs, constraint_type, ipx_solution,
        highs_basis, highs_solution);
    if (status != HighsStatus::kOk) {
      highsLogUser(
          options.log_options, HighsLogType::kError,
          "Failed to convert IPX basic solution to Highs basic solution\n");
      return HighsStatus::kError;
    }

  } else {
    // No basic solution, so get a non-vertex HiGHS solution. This
    // needs the model status to know whether to worry about dual
    // infeasibilities.
    const HighsModelStatus local_model_status =
        imprecise_solution ? HighsModelStatus::kUnknown
                           : HighsModelStatus::kOptimal;
    getHighsNonVertexSolution(options, lp, num_col, num_row, rhs,
                              constraint_type, lps, local_model_status,
                              highs_solution);
    assert(!highs_basis.valid);
  }
  highs_info.basis_validity =
      highs_basis.valid ? kBasisValidityValid : kBasisValidityInvalid;
  HighsStatus return_status;
  if (imprecise_solution) {
    model_status = HighsModelStatus::kUnknown;
    return_status = HighsStatus::kWarning;
  } else {
    model_status = HighsModelStatus::kOptimal;
    return_status = HighsStatus::kOk;
  }
  return return_status;
}